

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blurayHelper.cpp
# Opt level: O0

int __thiscall BlurayHelper::open(BlurayHelper *this,char *__file,int __oflag,...)

{
  string *__return_storage_ptr__;
  bool bVar1;
  char delimiter;
  int iVar2;
  IsoWriter *this_00;
  undefined8 uVar3;
  int in_ECX;
  uint in_R8D;
  byte in_R9B;
  string local_140;
  undefined4 local_120;
  undefined1 local_119;
  IsoHeaderData local_118;
  string local_b8;
  string local_98;
  undefined1 local_78 [8];
  string fileExt;
  bool useReproducibleIsoHeader_local;
  int extraISOBlocks_local;
  int64_t diskSize_local;
  DiskType dt_local;
  string *dst_local;
  BlurayHelper *this_local;
  
  __return_storage_ptr__ = (string *)(fileExt.field_2._M_local_buf + 8);
  toNativeSeparators(__return_storage_ptr__,(string *)__file);
  std::__cxx11::string::operator=((string *)&this->m_dstPath,(string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)__return_storage_ptr__);
  this->m_dt = __oflag;
  extractFileExt((string *)local_78,&this->m_dstPath);
  strToUpperCase(&local_b8,(string *)local_78);
  unquoteStr(&local_98,&local_b8);
  std::__cxx11::string::operator=((string *)local_78,(string *)&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_b8);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_78,"ISO");
  if (bVar1) {
    this_00 = (IsoWriter *)operator_new(0x930);
    local_119 = 1;
    if ((in_R9B & 1) == 0) {
      IsoHeaderData::normal();
    }
    else {
      IsoHeaderData::reproducible();
    }
    IsoWriter::IsoWriter(this_00,&local_118);
    local_119 = 0;
    this->m_isoWriter = this_00;
    IsoHeaderData::~IsoHeaderData(&local_118);
    IsoWriter::setLayerBreakPoint(this->m_isoWriter,0xba7200);
    iVar2 = IsoWriter::open(this->m_isoWriter,(char *)&this->m_dstPath,in_ECX,(ulong)in_R8D);
    this_local._7_1_ = (byte)iVar2 & 1;
  }
  else {
    delimiter = getDirSeparator();
    closeDirPath(&local_140,&this->m_dstPath,delimiter);
    std::__cxx11::string::operator=((string *)&this->m_dstPath,(string *)&local_140);
    std::__cxx11::string::~string((string *)&local_140);
    this_local._7_1_ = 1;
  }
  local_120 = 1;
  uVar3 = std::__cxx11::string::~string((string *)local_78);
  return (int)CONCAT71((int7)((ulong)uVar3 >> 8),this_local._7_1_);
}

Assistant:

bool BlurayHelper::open(const string& dst, const DiskType dt, const int64_t diskSize, const int extraISOBlocks,
                        const bool useReproducibleIsoHeader)
{
    m_dstPath = toNativeSeparators(dst);

    m_dt = dt;
    string fileExt = extractFileExt(m_dstPath);
    fileExt = unquoteStr(strToUpperCase(fileExt));
    if (fileExt == "ISO")
    {
        m_isoWriter = new IsoWriter(useReproducibleIsoHeader ? IsoHeaderData::reproducible() : IsoHeaderData::normal());
        m_isoWriter->setLayerBreakPoint(0xBA7200);  // around 25Gb
        return m_isoWriter->open(m_dstPath, diskSize, extraISOBlocks);
    }
    m_dstPath = closeDirPath(m_dstPath, getDirSeparator());
    return true;
}